

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gausschebyshev2.hpp
# Opt level: O0

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::quadrature_traits<IntegratorXX::GaussChebyshev2<double,_double>,_void>::generate
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,size_t npts)

{
  pointer pdVar1;
  long lVar2;
  reference pvVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double wi;
  double xi;
  weight_type ti;
  size_t i;
  size_t idx;
  undefined1 local_68 [8];
  point_container points;
  allocator<double> local_39;
  undefined1 local_38 [8];
  weight_container weights;
  weight_type pi_ov_npts_p_1;
  size_t npts_local;
  
  lVar2 = npts + 1;
  auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar7._0_8_ = lVar2;
  auVar7._12_4_ = 0x45300000;
  weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(3.141592653589793 /
                ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)));
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,npts,&local_39);
  std::allocator<double>::~allocator(&local_39);
  std::allocator<double>::allocator((allocator<double> *)((long)&idx + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,npts,
             (allocator<double> *)((long)&idx + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&idx + 7));
  for (i = 0; i < npts >> 1; i = i + 1) {
    lVar2 = npts - i;
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    dVar4 = cos(((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
                (double)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pdVar1 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    dVar5 = sqrt(-dVar4 * dVar4 + 1.0);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,i);
    *pvVar3 = dVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,i);
    *pvVar3 = (double)pdVar1 * dVar5;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,lVar2 - 1);
    *pvVar3 = -dVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,lVar2 - 1);
    *pvVar3 = (double)pdVar1 * dVar5;
  }
  if ((npts & 1) != 0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_68,npts >> 1);
    pdVar1 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    *pvVar3 = 0.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,npts >> 1);
    *pvVar3 = (value_type)pdVar1;
  }
  std::
  make_tuple<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&>
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_68,
             (vector<double,_std::allocator<double>_> *)local_38);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container, weight_container> generate(size_t npts) {
    const weight_type pi_ov_npts_p_1 = M_PI / (npts + 1);

    weight_container weights(npts);
    point_container points(npts);

    // Generate the first half explicitly and reflect
    for(size_t idx = 0; idx < npts/2; ++idx) {
      // Transform index here for two reasons: the mathematical
      // equations are for 1 <= i <= n, and the nodes are generated in
      // decreasing order. This generates them in the right order
      size_t i = npts - idx;

      // The standard nodes are given by
      const auto ti = i * pi_ov_npts_p_1;
      const auto xi = std::cos(ti);

      // The quadrature weight, transformed to unit weight factor in
      // [-1,1] is given by (see comments above for explanation)
      const auto wi = pi_ov_npts_p_1 * std::sqrt(1.0 - xi * xi);

      // Store into memory
      points[idx] = xi;
      weights[idx] = wi;

      // Reflect to second half
      points[i-1]  = -xi;
      weights[i-1] = wi; 
    }

    // Edge case for odd points
    if(npts % 2) {
      points[npts/2]  = 0.0;
      weights[npts/2] = pi_ov_npts_p_1;
    }

    return std::make_tuple(points, weights);
  }